

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void nary_starvation(size_t W)

{
  int iVar1;
  Taskflow *f;
  Task *rhs;
  void *__stat_loc;
  ulong in_RDI;
  Task task;
  size_t i;
  size_t p;
  size_t w;
  Task pivot;
  Task parent;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  atomic<unsigned_long> count;
  atomic<unsigned_long> stop;
  Executor executor;
  Taskflow taskflow;
  size_t N;
  string *in_stack_fffffffffffffbc8;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffbd0;
  Taskflow *this;
  Task *in_stack_fffffffffffffbd8;
  Executor *this_00;
  Taskflow *in_stack_fffffffffffffbf0;
  undefined1 *puVar2;
  Executor *this_01;
  element_type *in_stack_fffffffffffffc08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffc10;
  FlowBuilder *in_stack_fffffffffffffc18;
  allocator<char> local_3d1;
  string local_3d0 [40];
  ulong *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  string local_388 [32];
  ulong local_368;
  ulong local_360;
  ulong local_358;
  ulong *local_350;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffcb8;
  size_t in_stack_fffffffffffffcc0;
  Executor *in_stack_fffffffffffffcc8;
  Task local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  Task local_2f8;
  undefined1 local_2e9 [33];
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  Task local_2a8;
  undefined1 local_2a0 [96];
  undefined1 local_240 [8];
  undefined1 local_238 [24];
  Executor local_220;
  ulong local_10;
  ulong local_8;
  
  local_10 = 0x400;
  local_8 = in_RDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffbf0);
  this_01 = &local_220;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  tf::Executor::Executor
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11a3e1);
  std::mutex::mutex((mutex *)0x11a3ee);
  puVar2 = local_2a0;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x11a400);
  local_2c0 = local_240;
  local_2b8 = local_238;
  local_2c8 = puVar2;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:620:38),_nullptr>
            (in_stack_fffffffffffffc18,(anon_class_24_3_f686a84c *)in_stack_fffffffffffffc10._M_pi);
  this_00 = (Executor *)local_2e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc10._M_pi,(char *)in_stack_fffffffffffffc08,
             (allocator<char> *)this_01);
  f = (Taskflow *)tf::Task::name((Task *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  tf::Task::Task(&local_2a8,(Task *)f);
  std::__cxx11::string::~string((string *)(local_2e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2e9);
  tf::Task::Task(&local_2f8);
  for (local_300 = 0; local_300 < local_8; local_300 = local_300 + 1) {
    iVar1 = rand();
    local_308 = (ulong)(long)iVar1 % local_10;
    for (local_310 = 0; local_310 < local_10; local_310 = local_310 + 1) {
      local_368 = local_300;
      local_360 = local_308;
      local_358 = local_310;
      local_350 = &local_10;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:634:40),_nullptr>
                (in_stack_fffffffffffffc18,
                 (anon_class_72_9_86a690cb *)in_stack_fffffffffffffc10._M_pi);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc08);
      in_stack_fffffffffffffbd8 =
           tf::Task::name((Task *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      tf::Task::Task(&local_318,in_stack_fffffffffffffbd8);
      std::__cxx11::string::~string(local_388);
      tf::Task::precede<tf::Task&>
                ((Task *)in_stack_fffffffffffffbd0,(Task *)in_stack_fffffffffffffbc8);
      if (local_308 == local_310) {
        tf::Task::operator=(&local_2f8,&local_318);
      }
    }
    tf::Task::operator=(&local_2a8,&local_2f8);
  }
  local_3d0._32_8_ = local_240;
  local_3a8 = &local_8;
  local_3a0 = local_238;
  local_398 = local_2a0;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:668:28),_nullptr>
            (in_stack_fffffffffffffc18,(anon_class_32_4_5922fbb9 *)in_stack_fffffffffffffc10._M_pi);
  this = (Taskflow *)&local_3d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc10._M_pi,(char *)in_stack_fffffffffffffc08,
             (allocator<char> *)this_01);
  rhs = tf::Task::name((Task *)this,in_stack_fffffffffffffbc8);
  tf::Task::operator=(&local_2f8,rhs);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  tf::Task::precede<tf::Task&>((Task *)this,rhs);
  __stat_loc = (void *)((long)&local_220._taskflows_mutex.super___mutex_base._M_mutex + 0x10);
  tf::Executor::run_n(this_00,f,(size_t)in_stack_fffffffffffffbd8);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffc08,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)this);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x11a896);
  tf::Executor::~Executor(this_01);
  tf::Taskflow::~Taskflow(this);
  return;
}

Assistant:

void nary_starvation(size_t W) {
  
  size_t N = 1024;

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> stop, count;
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  tf::Task parent = taskflow.emplace([&](){ 
    set.clear();
    count.store(0, std::memory_order_relaxed);
    stop.store(false, std::memory_order_relaxed);
  }).name("root");

  tf::Task pivot;

  for(size_t w=0; w<W; w++) {
    
    // randomly choose a pivot to be the parent for the next level
    size_t p = rand()%N;

    for(size_t i=0; i<N; i++) {
      tf::Task task = taskflow.emplace([&, w, p, i](){
        
        // the blocker cannot be the pivot - others simply return
        if(i != (p+1)%N) {
          std::this_thread::yield();
          return;
        }
        
        // now I need to block
        if(w) {
          // record the worker
          {
            std::scoped_lock lock(mutex);
            set.insert(executor.this_worker_id());
          }

          count.fetch_add(1, std::memory_order_release);

          // block the worker
          while(stop.load(std::memory_order_relaxed) == false) {
            std::this_thread::yield();
          }
        }
      }).name(std::to_string(w));

      parent.precede(task);

      if(p == i) {
        pivot = task;
      }
    }
    parent = pivot;
  }

  pivot = taskflow.emplace([&](){
    // wait for the other W-1 workers to block
    while(count.load(std::memory_order_acquire) + 1 != W) {
      std::this_thread::yield();
    }
    stop.store(true, std::memory_order_relaxed);
    REQUIRE(set.size() + 1 == W);
  }).name("stop");

  parent.precede(pivot);

  //taskflow.dump(std::cout);

  executor.run_n(taskflow, 5).wait();
}